

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

string * positionDeque2String_abi_cxx11_(dequePositionTy *_l,positionTy *posAfterLast)

{
  bool bVar1;
  long in_RDX;
  string *in_RDI;
  vectorTy v;
  const_iterator iter;
  dequePositionTy l;
  string *ret;
  positionTy *in_stack_fffffffffffffdc8;
  positionTy *in_stack_fffffffffffffdd0;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *in_stack_fffffffffffffde0;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *this;
  string local_200 [32];
  deque<positionTy,_std::allocator<positionTy>_> *in_stack_fffffffffffffe20;
  double local_1d8;
  vectorTy *in_stack_fffffffffffffe58;
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> local_1a0;
  deque<positionTy,_std::allocator<positionTy>_> *in_stack_fffffffffffffe88;
  deque<positionTy,_std::allocator<positionTy>_> *in_stack_fffffffffffffe90;
  string local_160 [64];
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> local_120 [2];
  string local_e0 [64];
  _Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> local_a0 [2];
  positionTy *in_stack_ffffffffffffffa0;
  
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = std::deque<positionTy,_std::allocator<positionTy>_>::empty
                    ((deque<positionTy,_std::allocator<positionTy>_> *)0x130146);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)in_RDI,"<empty>\n");
  }
  else {
    std::deque<positionTy,_std::allocator<positionTy>_>::deque
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    std::deque<positionTy,_std::allocator<positionTy>_>::cbegin
              ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_fffffffffffffdc8);
    while( true ) {
      std::deque<positionTy,_std::allocator<positionTy>_>::cend
                ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_fffffffffffffdc8);
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffdd0,(_Self *)in_stack_fffffffffffffdc8)
      ;
      if (!bVar1) break;
      std::_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*>::operator->(local_a0)
      ;
      positionTy::dbgTxt_abi_cxx11_(in_stack_ffffffffffffffa0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_e0);
      std::__cxx11::string::~string(local_e0);
      this = local_120;
      std::_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*>::_Deque_iterator
                (this,local_a0);
      std::next<std::_Deque_iterator<positionTy,positionTy_const&,positionTy_const*>>
                (this,(difference_type)in_stack_fffffffffffffde0);
      std::deque<positionTy,_std::allocator<positionTy>_>::cend
                ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_fffffffffffffdc8);
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffdd0,(_Self *)in_stack_fffffffffffffdc8)
      ;
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)in_RDI,' ');
        in_stack_fffffffffffffdd0 = (positionTy *)local_a0;
        std::_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*>::operator->
                  ((_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *)
                   in_stack_fffffffffffffdd0);
        in_stack_fffffffffffffde0 =
             (_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *)
             &stack0xfffffffffffffe40;
        std::_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*>::_Deque_iterator
                  (in_stack_fffffffffffffde0,
                   (_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *)
                   in_stack_fffffffffffffdd0);
        std::next<std::_Deque_iterator<positionTy,positionTy_const&,positionTy_const*>>
                  (this,(difference_type)in_stack_fffffffffffffde0);
        std::_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*>::operator*
                  (&local_1a0);
        positionTy::between(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        vectorTy::operator_cast_to_string(in_stack_fffffffffffffe58);
        std::__cxx11::string::operator+=((string *)in_RDI,local_160);
        std::__cxx11::string::~string(local_160);
      }
      else if (in_RDX != 0) {
        std::_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*>::operator->
                  (local_a0);
        positionTy::between(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        if (1e-05 < local_1d8) {
          std::__cxx11::string::operator+=((string *)in_RDI,' ');
          vectorTy::operator_cast_to_string(in_stack_fffffffffffffe58);
          std::__cxx11::string::operator+=((string *)in_RDI,local_200);
          std::__cxx11::string::~string(local_200);
        }
      }
      std::__cxx11::string::operator+=((string *)in_RDI,'\n');
      std::_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*>::operator++
                ((_Deque_iterator<positionTy,_const_positionTy_&,_const_positionTy_*> *)
                 in_stack_fffffffffffffdd0);
    }
    std::deque<positionTy,_std::allocator<positionTy>_>::~deque(in_stack_fffffffffffffe20);
  }
  return in_RDI;
}

Assistant:

std::string positionDeque2String (const dequePositionTy& _l,
                                  const positionTy* posAfterLast)
{
    std::string ret;
    
    if (_l.empty())
        ret = "<empty>\n";
    else {
        // copy for better thread safety
        const dequePositionTy l(_l);
        for (dequePositionTy::const_iterator iter = l.cbegin();
            iter != l.cend();
            ++iter)
        {
            ret += iter->dbgTxt();              // add position info
            if (std::next(iter) != l.cend())    // there is a next position
            {
                ret += ' ';                     // add vector to next position
                ret += iter->between(*std::next(iter));
            } else if (posAfterLast) {          // a pos after last is given for final vector?
                const vectorTy v = iter->between(*posAfterLast);
                if (v.dist > 0.00001) {         // and that pos is not about the same as current
                    ret += ' ';                 // add vector to that position
                    ret += v;
                }
            }
            ret += '\n';
        }
    }
    return ret;
}